

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

Time __thiscall helics::EndpointInfo::firstMessageTime(EndpointInfo *this)

{
  _Elt_pointer puVar1;
  baseType bVar2;
  shared_handle handle;
  shared_handle local_20;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock_shared(&local_20,&this->message_queue);
  puVar1 = ((local_20.data)->
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((local_20.data)->
      super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      )._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) {
    bVar2 = 0x7fffffffffffffff;
  }
  else {
    bVar2 = (((puVar1->_M_t).
              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
              super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20.m_handle_lock);
  return (Time)bVar2;
}

Assistant:

Time EndpointInfo::firstMessageTime() const
{
    auto handle = message_queue.lock_shared();
    return (handle->empty()) ? Time::maxVal() : handle->front()->time;
}